

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::WriteWheatsheafMean
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,int epcalc,int eptype,
          int eptype_tvar,
          map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
          *mean_map)

{
  double dVar1;
  double dVar2;
  undefined4 uVar3;
  bool bVar4;
  size_type sVar5;
  reference ppVar6;
  reference pmVar7;
  int *piVar8;
  long *plVar9;
  code *local_e0;
  int local_ac;
  double dStack_a8;
  mean_count mc;
  iterator __end2;
  iterator __begin2;
  vector<mean_count,_std::allocator<mean_count>_> *__range2;
  int i;
  vector<mean_count,_std::allocator<mean_count>_> *rmc;
  pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_> s;
  iterator __end1;
  iterator __begin1;
  map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
  *__range1;
  map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
  *mean_map_local;
  int eptype_tvar_local;
  int eptype_local;
  int epcalc_local;
  vector<int,_std::allocator<int>_> *fileIDs_local;
  aggreports *this_local;
  
  sVar5 = std::
          map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
          ::size(mean_map);
  if (sVar5 != 0) {
    __end1 = std::
             map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
             ::begin(mean_map);
    s.second.super__Vector_base<mean_count,_std::allocator<mean_count>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                  ::end(mean_map);
    while (bVar4 = std::operator!=(&__end1,(_Self *)&s.second.
                                                  super__Vector_base<mean_count,_std::allocator<mean_count>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                  ), bVar4) {
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>
               ::operator*(&__end1);
      std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>::pair
                ((pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_> *)&rmc,
                 ppVar6);
      __end2 = std::vector<mean_count,_std::allocator<mean_count>_>::begin
                         ((vector<mean_count,_std::allocator<mean_count>_> *)&s);
      mc._16_8_ = std::vector<mean_count,_std::allocator<mean_count>_>::end
                            ((vector<mean_count,_std::allocator<mean_count>_> *)&s);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<mean_count_*,_std::vector<mean_count,_std::allocator<mean_count>_>_>
                                         *)&mc.count), bVar4) {
        pmVar7 = __gnu_cxx::
                 __normal_iterator<mean_count_*,_std::vector<mean_count,_std::allocator<mean_count>_>_>
                 ::operator*(&__end2);
        uVar3 = rmc._0_4_;
        mc.mean = *(double *)&pmVar7->count;
        dVar1 = pmVar7->retperiod;
        dVar2 = pmVar7->mean;
        dStack_a8 = dVar1;
        mc.retperiod = dVar2;
        if (this->WriteEPTOutput != 0 ||
            this->WriteEPTOutput != 0 && *(long *)&this->field_0x158 != 0) {
          local_e0 = (code *)this->WriteEPTOutput;
          plVar9 = (long *)((long)&this->totalperiods_ + *(long *)&this->field_0x158);
          if (((ulong)local_e0 & 1) != 0) {
            local_e0 = *(code **)(local_e0 + *plVar9 + -1);
          }
          local_ac = 1;
          piVar8 = std::max<int>((int *)&mc.mean,&local_ac);
          (*local_e0)(SUB84(dVar1,0),
                      CONCAT44((int)((ulong)(dVar2 / (double)*piVar8) >> 0x20),
                               (float)(dVar2 / (double)*piVar8)),plVar9,fileIDs,uVar3,epcalc,eptype)
          ;
        }
        __gnu_cxx::
        __normal_iterator<mean_count_*,_std::vector<mean_count,_std::allocator<mean_count>_>_>::
        operator++(&__end2);
      }
      std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>::~pair
                ((pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_> *)&rmc);
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void aggreports::WriteWheatsheafMean(const std::vector<int> &fileIDs,
	int epcalc, int eptype, int eptype_tvar,
	std::map<int, std::vector<mean_count>> *mean_map) {

  if (mean_map->size() == 0) return;

#ifdef ORD_OUTPUT
  if (os_ept_exists_ == false) {
    if (parquetFileNames_[EPT] != "") {
      os_ept_ = GetParquetStreamWriter(EPT);
      os_ept_exists_ = true;
    }
  }
#endif

  for (auto s : *mean_map) {
    std::vector<mean_count> &rmc = s.second;
    int i = 1;

    for (auto mc : rmc) {

      if (WriteEPTOutput != nullptr) {
	(this->*WriteEPTOutput)(fileIDs, s.first, epcalc, eptype, mc.retperiod,
				mc.mean / std::max(mc.count, 1));
      }

#ifdef ORD_OUTPUT
      if (parquetFileNames_[EPT] != "") {
	WriteParquetOutput(os_ept_, s.first, epcalc, eptype, mc.retperiod,
			   mc.mean / std::max(mc.count, 1));
      }
#endif

      i++;

    }

  }

}